

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt2obj.cpp
# Opt level: O1

void pbrt::writeObject(SP *object,affine3f *instanceXfm)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  element_type *peVar24;
  element_type *peVar25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var26;
  pointer psVar27;
  element_type *peVar28;
  ostream *poVar29;
  element_type *peVar30;
  pointer psVar31;
  pointer psVar32;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  affine3f local_98;
  SP local_68;
  SP local_58;
  undefined1 local_48 [16];
  
  local_48._8_8_ = local_48._0_8_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
  (**(((object->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_Entity)
     ._vptr_Entity)(&local_98);
  poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_98.l.vx._0_8_,
                       CONCAT44(local_98.l.vy.x,local_98.l.vx.z));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
  std::ostream::put((char)poVar29);
  std::ostream::flush();
  if ((float *)local_98.l.vx._0_8_ != &local_98.l.vy.y) {
    operator_delete((void *)local_98.l.vx._0_8_);
  }
  peVar24 = (object->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar31 = (peVar24->shapes).
            super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_48._0_8_ =
       (peVar24->shapes).
       super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar31 != (pointer)local_48._0_8_) {
    do {
      peVar25 = (psVar31->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var26 = (psVar31->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
      if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
        }
      }
      if (peVar25 == (element_type *)0x0) {
        peVar30 = (element_type *)0x0;
      }
      else {
        peVar30 = (element_type *)__dynamic_cast(peVar25,&Shape::typeinfo,&TriangleMesh::typeinfo,0)
        ;
      }
      this = p_Var26;
      if (peVar30 == (element_type *)0x0) {
        this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if (peVar30 != (element_type *)0x0 &&
          p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
          UNLOCK();
          this = p_Var26;
        }
        else {
          p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
          this = p_Var26;
        }
      }
      if (peVar30 == (element_type *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," - warning: shape is not a triangle mesh : ",0x2b);
        (**(peVar25->super_Entity)._vptr_Entity)(&local_98,peVar25);
        poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_98.l.vx._0_8_,
                             CONCAT44(local_98.l.vy.x,local_98.l.vx.z));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
        std::ostream::put((char)poVar29);
        std::ostream::flush();
        if ((float *)local_98.l.vx._0_8_ != &local_98.l.vy.y) {
          operator_delete((void *)local_98.l.vx._0_8_);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," - found mesh w/ ",0x11);
        poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar29," tris",5);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
        std::ostream::put((char)poVar29);
        std::ostream::flush();
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this->_M_use_count = this->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this->_M_use_count = this->_M_use_count + 1;
          }
        }
        local_58.super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar30
        ;
        local_58.super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = this;
        writeTriangleMesh(&local_58,instanceXfm);
        if (local_58.super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
      }
      psVar31 = psVar31 + 1;
    } while (psVar31 != (pointer)local_48._0_8_);
  }
  peVar24 = (object->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar32 = (peVar24->instances).
            super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar27 = (peVar24->instances).
            super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar32 != psVar27) {
    do {
      peVar28 = (psVar32->super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var26 = (psVar32->super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
        }
      }
      local_68.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (peVar28->object).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_68.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (peVar28->object).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_68.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_68.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_68.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_68.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_68.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      fVar1 = (instanceXfm->l).vx.z;
      fVar2 = (peVar28->xfm).l.vx.x;
      fVar3 = (peVar28->xfm).l.vx.y;
      fVar4 = (instanceXfm->l).vy.z;
      fVar5 = (peVar28->xfm).l.vx.z;
      fVar6 = (instanceXfm->l).vz.z;
      local_98.l.vx.z = fVar5 * fVar6 + fVar3 * fVar4 + fVar2 * fVar1;
      local_48 = ZEXT416((uint)local_98.l.vx.z);
      fVar7 = (peVar28->xfm).l.vy.x;
      fVar8 = (peVar28->xfm).l.vy.y;
      fVar9 = (peVar28->xfm).l.vy.z;
      local_98.l.vy.z = fVar6 * fVar9 + fVar4 * fVar8 + fVar1 * fVar7;
      fVar10 = (peVar28->xfm).l.vz.x;
      fVar11 = (peVar28->xfm).l.vz.y;
      fVar12 = (peVar28->xfm).l.vz.z;
      local_98.l.vz.z = fVar6 * fVar12 + fVar4 * fVar11 + fVar1 * fVar10;
      fVar13 = (peVar28->xfm).p.x;
      fVar14 = (peVar28->xfm).p.y;
      fVar15 = (peVar28->xfm).p.z;
      uVar16 = (instanceXfm->l).vx.x;
      uVar20 = (instanceXfm->l).vx.y;
      uVar17 = (instanceXfm->l).vy.x;
      uVar21 = (instanceXfm->l).vy.y;
      uVar18 = (instanceXfm->l).vz.x;
      uVar22 = (instanceXfm->l).vz.y;
      local_98.l.vy.x = fVar9 * (float)uVar18 + fVar8 * (float)uVar17 + fVar7 * (float)uVar16;
      local_98.l.vy.y = fVar9 * (float)uVar22 + fVar8 * (float)uVar21 + fVar7 * (float)uVar20;
      uVar19 = (instanceXfm->p).x;
      uVar23 = (instanceXfm->p).y;
      local_98.p.x = (float)uVar19 +
                     fVar15 * (float)uVar18 + fVar14 * (float)uVar17 + fVar13 * (float)uVar16;
      local_98.p.y = (float)uVar23 +
                     fVar15 * (float)uVar22 + fVar14 * (float)uVar21 + fVar13 * (float)uVar20;
      local_98.p.z = fVar6 * fVar15 + fVar4 * fVar14 + fVar1 * fVar13 + (instanceXfm->p).z;
      local_98.l.vx.y = fVar5 * (float)uVar22 + fVar3 * (float)uVar21 + fVar2 * (float)uVar20;
      local_98.l.vx.x = fVar5 * (float)uVar18 + fVar3 * (float)uVar17 + fVar2 * (float)uVar16;
      local_98.l.vz.y = fVar12 * (float)uVar22 + fVar11 * (float)uVar21 + fVar10 * (float)uVar20;
      local_98.l.vz.x = fVar12 * (float)uVar18 + fVar11 * (float)uVar17 + fVar10 * (float)uVar16;
      writeObject(&local_68,&local_98);
      if (local_68.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
      }
      psVar32 = psVar32 + 1;
    } while (psVar32 != psVar27);
  }
  return;
}

Assistant:

void writeObject(Object::SP object, 
                   const affine3f &instanceXfm)
  {
    cout << "writing " << object->toString() << endl;
    for (auto shape : object->shapes) {
      TriangleMesh::SP mesh = std::dynamic_pointer_cast<TriangleMesh>(shape);
      if (mesh) {
        std::cout << " - found mesh w/ " << mesh->index.size() << " tris" << std::endl;
        writeTriangleMesh(mesh,instanceXfm);
      } else
        std::cout << " - warning: shape is not a triangle mesh : " << shape->toString() << std::endl;
    }
      
    for (auto inst : object->instances) {
      writeObject(inst->object,
                  instanceXfm*inst->xfm);
    }
  }